

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

JavascriptString * __thiscall
Js::JavascriptString::ConcatDestructive(JavascriptString *this,JavascriptString *pstRight)

{
  CharCount appendCharLength;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptString *pJVar4;
  char16 *pcVar5;
  char16_t *pcVar6;
  
  if (pstRight == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x18c,"(pstRight)","pstRight");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((this->m_pszValue).ptr != (char16_t *)0x0) {
    appendCharLength = pstRight->m_charLength;
    if (this->m_charLength == 0 || appendCharLength == 0) {
      pJVar4 = ConcatDestructive_OneEmpty(this,pstRight);
      return pJVar4;
    }
    bVar2 = CompoundString::ShouldAppendChars(this->m_charLength);
    if ((bVar2) && (bVar2 = CompoundString::ShouldAppendChars(appendCharLength), bVar2)) {
      pJVar4 = ConcatDestructive_CompoundAppendChars(this,pstRight);
      return pJVar4;
    }
LAB_00bba7f4:
    StringProfiler::RecordConcatenation
              ((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr,this->m_charLength,
               pstRight->m_charLength,ConcatType_ConcatTree);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,StringConcatPhase);
    if (bVar2) {
      pcVar6 = L"...";
      if ((pstRight->m_pszValue).ptr == (char16_t *)0x0) {
        pcVar5 = L"";
      }
      else {
        pcVar5 = GetString(pstRight);
        if (((pstRight->m_pszValue).ptr != (char16_t *)0x0) &&
           (pcVar6 = L"", 8 < pstRight->m_charLength)) {
          pcVar6 = L"...";
        }
      }
      Output::Print(L"JavascriptString::ConcatDestructive(\"%.8s%s\") - creating ConcatString\n",
                    pcVar5,pcVar6);
      Output::Flush();
    }
    pJVar4 = (JavascriptString *)ConcatString::New(this,pstRight);
    return pJVar4;
  }
  bVar2 = VarIsImpl<Js::CompoundString>(&this->super_RecyclableObject);
  if (bVar2) {
    ConcatDestructive_Compound(this,pstRight);
    pJVar4 = this;
  }
  else if (((this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject !=
            (_func_int **)VirtualTableInfo<Js::ConcatString>::Address) ||
          (pJVar4 = ConcatDestructive_ConcatToCompound(this,pstRight),
          pJVar4 == (JavascriptString *)0x0)) goto LAB_00bba7f4;
  return pJVar4;
}

Assistant:

JavascriptString* JavascriptString::ConcatDestructive(JavascriptString* pstRight)
    {
        Assert(pstRight);

        if(!IsFinalized())
        {
            if(VarIs<CompoundString>(this))
            {
                return ConcatDestructive_Compound(pstRight);
            }

            if(VirtualTableInfo<ConcatString>::HasVirtualTable(this))
            {
                JavascriptString *const s = ConcatDestructive_ConcatToCompound(pstRight);
                if(s)
                {
                    return s;
                }
            }
        }
        else
        {
            const CharCount leftLength = GetLength();
            const CharCount rightLength = pstRight->GetLength();
            if(leftLength == 0 || rightLength == 0)
            {
                return ConcatDestructive_OneEmpty(pstRight);
            }

            if(CompoundString::ShouldAppendChars(leftLength) && CompoundString::ShouldAppendChars(rightLength))
            {
                return ConcatDestructive_CompoundAppendChars(pstRight);
            }
        }

#ifdef PROFILE_STRINGS
        StringProfiler::RecordConcatenation(GetScriptContext(), GetLength(), pstRight->GetLength(), ConcatType_ConcatTree);
#endif
        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("JavascriptString::ConcatDestructive(\"%.8s%s\") - creating ConcatString\n"),
                pstRight->IsFinalized() ? pstRight->GetString() : _u(""),
                !pstRight->IsFinalized() || pstRight->GetLength() > 8 ? _u("...") : _u(""));
            Output::Flush();
        }

        return ConcatString::New(this, pstRight);
    }